

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall md::Code::not_to_dx(Code *this,DataRegister *reg,Size size)

{
  short sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  uint16_t local_20;
  short local_1e;
  Size local_1c;
  uint16_t opcode;
  uint16_t size_code;
  Size size_local;
  DataRegister *reg_local;
  Code *this_local;
  
  local_1e = 0;
  if (size == WORD) {
    local_1e = 1;
  }
  else if (size == LONG) {
    local_1e = 2;
  }
  sVar1 = local_1e * 0x40;
  local_1c = size;
  _opcode = reg;
  reg_local = (DataRegister *)this;
  local_20 = Param::getMXn((Param *)reg);
  local_20 = sVar1 + 0x4600 + local_20;
  add_opcode(this,local_20);
  (*(_opcode->super_Register).super_Param._vptr_Param[2])();
  add_bytes(this,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  return this;
}

Assistant:

Code& Code::not_to_dx(const DataRegister& reg, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x4600 + (size_code << 6) + reg.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(reg.getAdditionnalData());

    return *this;
}